

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_selection.cpp
# Opt level: O1

InstListIter
mocker::anon_unknown_0::genInst
          (Section *text,FuncSelectionContext *ctx,FunctionModule *func,const_iterator curBBIter,
          const_iterator bbIterEnd,InstListIter curInstIter)

{
  size_type *psVar1;
  key_type *pkVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  long *plVar8;
  OpType *pOVar9;
  OpType *args;
  shared_ptr<mocker::nasm::Register> *args_00;
  const_iterator cVar10;
  _List_node_base *p_Var11;
  _List_node_base *p_Var12;
  _List_node_base *p_Var13;
  _List_node_base *p_Var14;
  _List_node_base *p_Var15;
  char cVar16;
  Section *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var18;
  key_type *__k;
  shared_ptr<mocker::nasm::Addr> val;
  shared_ptr<mocker::ir::Reg> global;
  shared_ptr<mocker::ir::Reg> irAddr;
  shared_ptr<mocker::nasm::Addr> rhs;
  undefined1 local_d8 [32];
  _Prime_rehash_policy local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [40];
  undefined1 local_70 [32];
  initializer_list<std::pair<mocker::ir::RelationInst::OpType,_mocker::nasm::Set::OpType>_> local_50
  ;
  OpType local_3c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  p_Var14 = (bbIterEnd._M_node)->_M_next;
  p_Var13 = bbIterEnd._M_node[1]._M_next;
  p_Var15 = (_List_node_base *)(func->identifier)._M_dataplus._M_p;
  if (*(int *)&p_Var13->_M_prev == 1) {
    p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)bbIterEnd._M_node[1]._M_prev;
    if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
      }
    }
  }
  else {
    p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var13 = (_List_node_base *)0x0;
  }
  if (p_Var13 == (_List_node_base *)0x0) {
    p_Var12 = bbIterEnd._M_node[1]._M_next;
    if (*(int *)&p_Var12->_M_prev == 2) {
      this = (Section *)bbIterEnd._M_node[1]._M_prev;
      if (this != (Section *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          psVar1 = &(this->name)._M_string_length;
          *(int *)psVar1 = (int)*psVar1 + 1;
          UNLOCK();
        }
        else {
          psVar1 = &(this->name)._M_string_length;
          *(int *)psVar1 = (int)*psVar1 + 1;
        }
      }
    }
    else {
      p_Var12 = (_List_node_base *)0x0;
      this = (Section *)0x0;
    }
    bVar6 = p_Var12 != (_List_node_base *)0x0;
  }
  else {
    bVar6 = true;
    this = text;
  }
  if (this != (Section *)0x0 && p_Var13 == (_List_node_base *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
  }
  if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
  }
  if (bVar6) {
    return (InstListIter)p_Var14;
  }
  p_Var13 = bbIterEnd._M_node[1]._M_next;
  if (*(int *)&p_Var13->_M_prev == 0xf) {
    p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)bbIterEnd._M_node[1]._M_prev;
    if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
      }
    }
  }
  else {
    p_Var13 = (_List_node_base *)0x0;
    p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
  }
  if (p_Var13 != (_List_node_base *)0x0) {
    return (InstListIter)p_Var14;
  }
  p_Var13 = bbIterEnd._M_node[1]._M_next;
  if (*(int *)&p_Var13->_M_prev == 3) {
    p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)bbIterEnd._M_node[1]._M_prev;
    if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
      }
    }
  }
  else {
    p_Var13 = (_List_node_base *)0x0;
    p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  if (p_Var13 == (_List_node_base *)0x0) {
    if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
    }
    p_Var13 = bbIterEnd._M_node[1]._M_next;
    if (*(int *)&p_Var13->_M_prev == 0xc) {
      p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)bbIterEnd._M_node[1]._M_prev;
      if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
        }
      }
    }
    else {
      p_Var13 = (_List_node_base *)0x0;
      p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    if (p_Var13 != (_List_node_base *)0x0) {
      if ((p_Var15 == curBBIter._M_node) || (p_Var15[1]._M_next != (p_Var13[1]._M_prev)->_M_prev)) {
        p_Var13 = (p_Var13[1]._M_prev)->_M_prev;
        cVar16 = '\x01';
        if ((_List_node_base *)0x9 < p_Var13) {
          p_Var15 = p_Var13;
          cVar5 = '\x04';
          do {
            cVar16 = cVar5;
            if (p_Var15 < (_List_node_base *)0x64) {
              cVar16 = cVar16 + -2;
              goto LAB_00118caf;
            }
            if (p_Var15 < (_List_node_base *)0x3e8) {
              cVar16 = cVar16 + -1;
              goto LAB_00118caf;
            }
            if (p_Var15 < (_List_node_base *)0x2710) goto LAB_00118caf;
            bVar6 = (_List_node_base *)0x1869f < p_Var15;
            p_Var15 = (_List_node_base *)((ulong)p_Var15 / 10000);
            cVar5 = cVar16 + '\x04';
          } while (bVar6);
          cVar16 = cVar16 + '\x01';
        }
LAB_00118caf:
        local_98._0_8_ = (_List_node_base *)(local_98 + 0x10);
        std::__cxx11::string::_M_construct((ulong)local_98,cVar16);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)local_98._0_8_,local_98._8_4_,(unsigned_long)p_Var13);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x1ae6b6);
        p_Var13 = (_List_node_base *)(plVar8 + 2);
        if ((_List_node_base *)*plVar8 == p_Var13) {
          local_d8._16_8_ = p_Var13->_M_next;
          local_d8._24_8_ = plVar8[3];
          local_d8._0_8_ = (_List_node_base *)(local_d8 + 0x10);
        }
        else {
          local_d8._16_8_ = p_Var13->_M_next;
          local_d8._0_8_ = (_List_node_base *)*plVar8;
        }
        local_d8._8_8_ = plVar8[1];
        *plVar8 = (long)p_Var13;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        local_a8._0_8_ = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<mocker::nasm::Label,std::allocator<mocker::nasm::Label>,std::__cxx11::string>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8),(Label **)local_a8,
                   (allocator<mocker::nasm::Label> *)local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
        nasm::Section::emplaceInst<mocker::nasm::Jmp,std::shared_ptr<mocker::nasm::Label>>
                  (text,(shared_ptr<mocker::nasm::Label> *)local_a8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
        }
        if ((_List_node_base *)local_d8._0_8_ != (_List_node_base *)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
        }
        if ((_List_node_base *)local_98._0_8_ != (_List_node_base *)(local_98 + 0x10)) {
          operator_delete((void *)local_98._0_8_,
                          (ulong)((long)(_Hash_node_base **)local_98._16_8_ + 1));
        }
      }
      goto joined_r0x00119fc1;
    }
    if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
    }
    p_Var13 = bbIterEnd._M_node[1]._M_next;
    if (*(int *)&p_Var13->_M_prev == 7) {
      p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)bbIterEnd._M_node[1]._M_prev;
      if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
        }
      }
    }
    else {
      p_Var13 = (_List_node_base *)0x0;
      p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    if (p_Var13 == (_List_node_base *)0x0) {
      if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
      }
      p_Var13 = bbIterEnd._M_node[1]._M_next;
      if (*(int *)&p_Var13->_M_prev == 8) {
        p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)bbIterEnd._M_node[1]._M_prev;
        if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
          }
        }
      }
      else {
        p_Var13 = (_List_node_base *)0x0;
        p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      if (p_Var13 != (_List_node_base *)0x0) {
        local_98._0_8_ = p_Var13[1]._M_prev;
        local_98._8_8_ = p_Var13[2]._M_next;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_)->_M_use_count + 1;
          }
        }
        FuncSelectionContext::getIrAddr
                  ((FuncSelectionContext *)local_d8,(shared_ptr<mocker::ir::Addr> *)ctx);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
        }
        ir::detail::dyc_impl<mocker::ir::Reg,std::shared_ptr<mocker::ir::Addr>const&>
                  ((shared_ptr<mocker::ir::Addr> *)local_98,(Reg *)&p_Var13[2]._M_prev);
        if ((_List_node_base *)local_98._0_8_ == (_List_node_base *)0x0) {
          __assert_fail("irAddr",
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/instruction_selection.cpp"
                        ,0x71,
                        "void mocker::(anonymous namespace)::genLoad(nasm::Section &, FuncSelectionContext &, const std::shared_ptr<ir::Load> &)"
                       );
        }
        ir::dycGlobalReg((ir *)local_a8,(shared_ptr<mocker::ir::Addr> *)&p_Var13[2]._M_prev);
        if ((element_type *)local_a8._0_8_ == (element_type *)0x0) {
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
          }
          FuncSelectionContext::buildMemAddr
                    ((FuncSelectionContext *)local_a8,(shared_ptr<mocker::ir::Reg> *)ctx);
          nasm::Section::
          emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::MemoryAddr>>
                    (text,(shared_ptr<mocker::nasm::Addr> *)local_d8,
                     (shared_ptr<mocker::nasm::MemoryAddr> *)local_a8);
        }
        else {
          makeLabelAddr((anon_unknown_0 *)local_70,(shared_ptr<mocker::ir::Reg> *)local_a8);
          nasm::Section::
          emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::LabelAddr>>
                    (text,(shared_ptr<mocker::nasm::Addr> *)local_d8,
                     (shared_ptr<mocker::nasm::LabelAddr> *)local_70);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
        }
        goto joined_r0x00119fc1;
      }
      if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
      }
      local_d8._0_8_ = bbIterEnd._M_node[1]._M_next;
      if (*(int *)&((_List_node_base *)local_d8._0_8_)->_M_prev == 5) {
        local_d8._8_8_ = bbIterEnd._M_node[1]._M_prev;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count + 1;
          }
        }
      }
      else {
        local_d8._0_8_ = (_List_node_base *)0x0;
        local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      if ((_List_node_base *)local_d8._0_8_ != (_List_node_base *)0x0) {
        local_98._0_8_ = p_Var14[1]._M_next;
        p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var14[1]._M_prev;
        if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
          }
        }
        if (*(int *)&((_List_node_base *)local_98._0_8_)->_M_prev == 5) {
          local_98._8_8_ = p_Var18;
          if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
            }
          }
        }
        else {
          local_98._0_8_ = (_List_node_base *)0x0;
          local_98._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        if ((_List_node_base *)local_98._0_8_ == (_List_node_base *)0x0) {
          genArithBinary(text,ctx,(shared_ptr<mocker::ir::ArithBinaryInst> *)local_d8);
        }
        else {
          bVar6 = tryCombineMemInst(text,ctx,(shared_ptr<mocker::ir::ArithBinaryInst> *)local_d8,
                                    (shared_ptr<mocker::ir::ArithBinaryInst> *)local_98,
                                    (shared_ptr<mocker::ir::IRInst> *)(p_Var14->_M_next + 1));
          if (bVar6) {
            p_Var14 = p_Var14->_M_next->_M_next;
          }
          else {
            genArithBinary(text,ctx,(shared_ptr<mocker::ir::ArithBinaryInst> *)local_d8);
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
        }
        p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
        if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
          p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
        }
        goto joined_r0x00119fc1;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
      }
      p_Var13 = bbIterEnd._M_node[1]._M_next;
      if (*(int *)&p_Var13->_M_prev == 6) {
        p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)bbIterEnd._M_node[1]._M_prev;
        if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
          }
        }
      }
      else {
        p_Var13 = (_List_node_base *)0x0;
        p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      if (p_Var13 != (_List_node_base *)0x0) {
        if (p_Var15 == curBBIter._M_node) {
          p_Var15 = (_List_node_base *)0xffffffffffffffff;
        }
        else {
          p_Var15 = p_Var15[1]._M_next;
        }
        p_Var12 = p_Var14[1]._M_next;
        if (*(int *)&p_Var12->_M_prev == 0xb) {
          p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var14[1]._M_prev;
          if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var18->_M_use_count = p_Var18->_M_use_count + 1;
            }
          }
        }
        else {
          p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var12 = (_List_node_base *)0x0;
        }
        local_38 = p_Var17;
        if (p_Var12 == (_List_node_base *)0x0) {
          local_70._24_8_ = local_70._24_8_ & 0xffffffff00000000;
        }
        else {
          local_98._0_8_ = p_Var13[1]._M_prev;
          local_98._8_8_ = p_Var13[2]._M_next;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_)->_M_use_count +
                   1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_)->_M_use_count +
                   1;
            }
          }
          ir::dycLocalReg((ir *)local_a8,(shared_ptr<mocker::ir::Addr> *)&p_Var12[1]._M_prev);
          if (((((element_type *)local_a8._0_8_ == (element_type *)0x0) ||
               (p_Var11 = (_List_node_base *)((string *)(local_a8._0_8_ + 8))->_M_string_length,
               p_Var11 != ((_List_node_base *)(local_98._0_8_ + 0x10))->_M_next)) ||
              ((p_Var11 != (_List_node_base *)0x0 &&
               (iVar7 = bcmp((_List_node_base *)(((string *)(local_a8._0_8_ + 8))->_M_dataplus)._M_p
                             ,*(void **)(local_98._0_8_ + 8),(size_t)p_Var11), iVar7 != 0)))) ||
             (((p_Var12[2]._M_prev)->_M_prev != p_Var15 &&
              ((p_Var12[3]._M_prev)->_M_prev != p_Var15)))) {
            local_70._24_8_ = (ulong)(uint)local_70._28_4_ << 0x20;
          }
          else {
            DefUseChain::getUses
                      ((vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>
                        *)local_d8,&ctx->defUse,(shared_ptr<mocker::ir::Reg> *)local_98);
            local_70._24_4_ =
                 (int)CONCAT71((int7)((long)(local_d8._8_8_ - local_d8._0_8_) >> 0xb),
                               (ulong)(((long)(local_d8._8_8_ - local_d8._0_8_) >> 3) *
                                      -0x5555555555555555) < 2);
            std::vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_>::
            ~vector((vector<mocker::DefUseChain::Use,_std::allocator<mocker::DefUseChain::Use>_> *)
                    local_d8);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
          }
        }
        if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
        }
        FuncSelectionContext::getIrAddr
                  ((FuncSelectionContext *)local_a8,(shared_ptr<mocker::ir::Addr> *)ctx);
        nasm::dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>&>
                  ((nasm *)local_d8,(shared_ptr<mocker::nasm::Addr> *)local_a8);
        uVar3 = local_d8._0_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
        }
        if ((_List_node_base *)uVar3 == (_List_node_base *)0x0) {
          local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_d8._16_8_ = local_d8._16_8_ & 0xffffffffffffff00;
          local_d8._0_8_ = (_List_node_base *)(local_d8 + 0x10);
          FuncSelectionContext::newVirtualReg((FuncSelectionContext *)local_98,(string *)ctx);
          uVar4 = local_98._8_8_;
          local_a8._0_8_ = local_98._0_8_;
          uVar3 = local_a8._8_8_;
          local_98._0_8_ = (_List_node_base *)0x0;
          local_98._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_a8._8_8_ = uVar4;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
          }
          if ((_List_node_base *)local_d8._0_8_ != (_List_node_base *)(local_d8 + 0x10)) {
            operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
          }
          FuncSelectionContext::getIrAddr
                    ((FuncSelectionContext *)local_d8,(shared_ptr<mocker::ir::Addr> *)ctx);
          nasm::Section::
          emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Addr>>
                    (text,(shared_ptr<mocker::nasm::Addr> *)local_a8,
                     (shared_ptr<mocker::nasm::Addr> *)local_d8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
          }
        }
        FuncSelectionContext::getIrAddr
                  ((FuncSelectionContext *)local_70,(shared_ptr<mocker::ir::Addr> *)ctx);
        nasm::dyc<mocker::nasm::LabelAddr,std::shared_ptr<mocker::nasm::Addr>&>
                  ((nasm *)local_d8,(shared_ptr<mocker::nasm::Addr> *)local_70);
        if ((_List_node_base *)local_d8._0_8_ != (_List_node_base *)0x0) {
          __assert_fail("!nasm::dyc<nasm::LabelAddr>(rhs)",
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/instruction_selection.cpp"
                        ,0xde,
                        "bool mocker::(anonymous namespace)::genRelation(nasm::Section &, FuncSelectionContext &, const std::shared_ptr<ir::RelationInst> &, const std::shared_ptr<ir::IRInst> &, std::size_t)"
                       );
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
        }
        nasm::Section::
        emplaceInst<mocker::nasm::Cmp,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Addr>&>
                  (text,(shared_ptr<mocker::nasm::Addr> *)local_a8,
                   (shared_ptr<mocker::nasm::Addr> *)local_70);
        if (local_70[0x18] == '\0') {
          local_50._M_array = (iterator)p_Var13[1]._M_prev;
          local_50._M_len = (size_type)p_Var13[2]._M_next;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_len !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_len)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_len)->_M_use_count +
                   1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_len)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_len)->_M_use_count +
                   1;
            }
          }
          FuncSelectionContext::getIrAddr
                    ((FuncSelectionContext *)local_d8,(shared_ptr<mocker::ir::Addr> *)ctx);
          nasm::dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>>
                    ((nasm *)local_98,(shared_ptr<mocker::nasm::Addr> *)local_d8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_len !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_len);
          }
          local_d8._0_8_ = (element_type *)0x0;
          local_d8._8_8_ = operator_new(0x20);
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_weak_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_vptr__Sp_counted_base =
               (_func_int **)&PTR___Sp_counted_ptr_inplace_001efff8;
          local_d8._0_8_ = local_d8._8_8_ + 0x10;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._8_8_ + 0x10))->
          _vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001f0048;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._8_8_ + 0x10))->_M_use_count =
               0;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._8_8_ + 0x10))->_M_weak_count =
               0;
          nasm::Section::
          emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::NumericConstant>>
                    (text,(shared_ptr<mocker::nasm::Register> *)local_98,
                     (shared_ptr<mocker::nasm::NumericConstant> *)local_d8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
          }
          if (((anonymous_namespace)::
               genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
               ::mp == '\0') &&
             (iVar7 = __cxa_guard_acquire(&(anonymous_namespace)::
                                           genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                                           ::mp), iVar7 != 0)) {
            local_d8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000001;
            local_d8._16_8_ = (_List_node_base *)0x200000002;
            local_d8._24_8_ = 0x300000004;
            local_b8._M_max_load_factor = 4.2039e-45;
            local_b8._4_4_ = 4;
            local_b8._M_next_resize = 0x500000005;
            local_50._M_len = 6;
            local_50._M_array = (iterator)local_d8;
            SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::Set::OpType>::SmallMap
                      ((SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::Set::OpType> *)
                       (anonymous_namespace)::
                       genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                       ::mp,&local_50);
            __cxa_atexit(SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::Set::OpType>::
                         ~SmallMap,
                         (anonymous_namespace)::
                         genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                         ::mp,&__dso_handle);
            __cxa_guard_release(&(anonymous_namespace)::
                                 genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                                 ::mp);
          }
          if ((nasm::rax()::res == '\0') &&
             (iVar7 = __cxa_guard_acquire(&nasm::rax()::res), iVar7 != 0)) {
            nasm::rax::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                      (&nasm::rax::res.
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(Register **)&nasm::rax::res,
                       (allocator<mocker::nasm::Register> *)local_d8,(char (*) [4])"rax");
            __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                         ~__shared_ptr,&nasm::rax::res,&__dso_handle);
            __cxa_guard_release(&nasm::rax()::res);
          }
          local_d8._0_8_ = (element_type *)0x0;
          local_d8._8_8_ = operator_new(0x20);
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_weak_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_vptr__Sp_counted_base =
               (_func_int **)&PTR___Sp_counted_ptr_inplace_001efff8;
          local_d8._0_8_ = local_d8._8_8_ + 0x10;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._8_8_ + 0x10))->
          _vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001f0048;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._8_8_ + 0x10))->_M_use_count =
               0;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._8_8_ + 0x10))->_M_weak_count =
               0;
          nasm::Section::
          emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::NumericConstant>>
                    (text,&nasm::rax::res,(shared_ptr<mocker::nasm::NumericConstant> *)local_d8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
          }
          local_d8._0_4_ = *(undefined4 *)&p_Var13[2]._M_prev;
          args = SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::Set::OpType>::at
                           ((SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::Set::OpType> *
                            )(anonymous_namespace)::
                             genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                             ::mp,(OpType *)local_d8);
          if ((nasm::rax()::res == '\0') &&
             (iVar7 = __cxa_guard_acquire(&nasm::rax()::res), iVar7 != 0)) {
            nasm::rax::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                      (&nasm::rax::res.
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(Register **)&nasm::rax::res,
                       (allocator<mocker::nasm::Register> *)&local_50,(char (*) [4])"rax");
            __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                         ~__shared_ptr,&nasm::rax::res,&__dso_handle);
            __cxa_guard_release(&nasm::rax()::res);
          }
          nasm::Section::
          emplaceInst<mocker::nasm::Set,mocker::nasm::Set::OpType_const&,std::shared_ptr<mocker::nasm::Register>const&>
                    (text,args,&nasm::rax::res);
          if ((nasm::rax()::res == '\0') &&
             (iVar7 = __cxa_guard_acquire(&nasm::rax()::res), iVar7 != 0)) {
            nasm::rax::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                      (&nasm::rax::res.
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(Register **)&nasm::rax::res,
                       (allocator<mocker::nasm::Register> *)local_d8,(char (*) [4])"rax");
            __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                         ~__shared_ptr,&nasm::rax::res,&__dso_handle);
            __cxa_guard_release(&nasm::rax()::res);
          }
          nasm::Section::
          emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Register>const&>
                    (text,(shared_ptr<mocker::nasm::Register> *)local_98,&nasm::rax::res);
          p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_;
        }
        else {
          if (((anonymous_namespace)::
               genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
               ::Jump2ThenMap == '\0') &&
             (iVar7 = __cxa_guard_acquire(&(anonymous_namespace)::
                                           genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                                           ::Jump2ThenMap), iVar7 != 0)) {
            local_d8._0_8_ = (_List_node_base *)0x0;
            local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000001;
            local_d8._16_8_ = (_List_node_base *)0x200000002;
            local_d8._24_8_ = 0x300000004;
            local_b8._M_max_load_factor = 4.2039e-45;
            local_b8._4_4_ = 4;
            local_b8._M_next_resize = 0x500000005;
            local_98._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6;
            local_98._0_8_ = (_List_node_base *)local_d8;
            SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType>::SmallMap
                      ((SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType> *)
                       (anonymous_namespace)::
                       genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                       ::Jump2ThenMap,
                       (initializer_list<std::pair<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType>_>
                        *)local_98);
            __cxa_atexit(SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType>::
                         ~SmallMap,
                         (anonymous_namespace)::
                         genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                         ::Jump2ThenMap,&__dso_handle);
            __cxa_guard_release(&(anonymous_namespace)::
                                 genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                                 ::Jump2ThenMap);
          }
          if (((anonymous_namespace)::
               genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
               ::Jump2ElseMap == '\0') &&
             (iVar7 = __cxa_guard_acquire(&(anonymous_namespace)::
                                           genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                                           ::Jump2ElseMap), iVar7 != 0)) {
            local_d8._0_8_ = (_List_node_base *)0x100000000;
            local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
            local_d8._16_8_ = (_List_node_base *)0x500000002;
            local_d8._24_8_ = 0x400000004;
            local_b8._M_max_load_factor = 4.2039e-45;
            local_b8._4_4_ = 3;
            local_b8._M_next_resize = 0x200000005;
            local_98._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6;
            local_98._0_8_ = (_List_node_base *)local_d8;
            SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType>::SmallMap
                      ((SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType> *)
                       (anonymous_namespace)::
                       genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                       ::Jump2ElseMap,
                       (initializer_list<std::pair<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType>_>
                        *)local_98);
            __cxa_atexit(SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType>::
                         ~SmallMap,
                         (anonymous_namespace)::
                         genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                         ::Jump2ElseMap,&__dso_handle);
            __cxa_guard_release(&(anonymous_namespace)::
                                 genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                                 ::Jump2ElseMap);
          }
          p_Var12 = p_Var14[1]._M_next;
          if (*(int *)&p_Var12->_M_prev == 0xb) {
            p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var14[1]._M_prev;
            if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
              }
            }
          }
          else {
            p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var12 = (_List_node_base *)0x0;
          }
          if ((p_Var12[2]._M_prev)->_M_prev == p_Var15) {
            local_3c = *(OpType *)&p_Var13[2]._M_prev;
            pOVar9 = SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType>::at
                               ((SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType>
                                 *)(anonymous_namespace)::
                                   genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                                   ::Jump2ElseMap,&local_3c);
            p_Var13 = (p_Var12[3]._M_prev)->_M_prev;
            cVar16 = '\x01';
            if ((_List_node_base *)0x9 < p_Var13) {
              p_Var15 = p_Var13;
              cVar5 = '\x04';
              do {
                cVar16 = cVar5;
                if (p_Var15 < (_List_node_base *)0x64) {
                  cVar16 = cVar16 + -2;
                  goto LAB_00119ac9;
                }
                if (p_Var15 < (_List_node_base *)0x3e8) {
                  cVar16 = cVar16 + -1;
                  goto LAB_00119ac9;
                }
                if (p_Var15 < (_List_node_base *)0x2710) goto LAB_00119ac9;
                bVar6 = (_List_node_base *)0x1869f < p_Var15;
                p_Var15 = (_List_node_base *)((ulong)p_Var15 / 10000);
                cVar5 = cVar16 + '\x04';
              } while (bVar6);
              cVar16 = cVar16 + '\x01';
            }
LAB_00119ac9:
            local_98._0_8_ = local_98 + 0x10;
            std::__cxx11::string::_M_construct((ulong)local_98,cVar16);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      ((char *)local_98._0_8_,local_98._8_4_,(unsigned_long)p_Var13);
            plVar8 = (long *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x1ae6b6);
            local_d8._0_8_ = local_d8 + 0x10;
            p_Var13 = (_List_node_base *)(plVar8 + 2);
            if ((_List_node_base *)*plVar8 == p_Var13) {
              local_d8._16_8_ = p_Var13->_M_next;
              local_d8._24_8_ = plVar8[3];
            }
            else {
              local_d8._16_8_ = p_Var13->_M_next;
              local_d8._0_8_ = (_List_node_base *)*plVar8;
            }
            local_d8._8_8_ = plVar8[1];
            *plVar8 = (long)p_Var13;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            local_50._M_array = (iterator)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::nasm::Label,std::allocator<mocker::nasm::Label>,std::__cxx11::string>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_len,
                       (Label **)&local_50,(allocator<mocker::nasm::Label> *)(local_70 + 0x17),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                      );
            nasm::Section::
            emplaceInst<mocker::nasm::CJump,mocker::nasm::CJump::OpType_const&,std::shared_ptr<mocker::nasm::Label>>
                      (text,pOVar9,(shared_ptr<mocker::nasm::Label> *)&local_50);
          }
          else {
            local_3c = *(OpType *)&p_Var13[2]._M_prev;
            pOVar9 = SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType>::at
                               ((SmallMap<mocker::ir::RelationInst::OpType,_mocker::nasm::CJump::OpType>
                                 *)(anonymous_namespace)::
                                   genRelation(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::RelationInst>const&,std::shared_ptr<mocker::ir::IRInst>const&,unsigned_long)
                                   ::Jump2ThenMap,&local_3c);
            p_Var13 = (p_Var12[2]._M_prev)->_M_prev;
            cVar16 = '\x01';
            if ((_List_node_base *)0x9 < p_Var13) {
              p_Var15 = p_Var13;
              cVar5 = '\x04';
              do {
                cVar16 = cVar5;
                if (p_Var15 < (_List_node_base *)0x64) {
                  cVar16 = cVar16 + -2;
                  goto LAB_00119b96;
                }
                if (p_Var15 < (_List_node_base *)0x3e8) {
                  cVar16 = cVar16 + -1;
                  goto LAB_00119b96;
                }
                if (p_Var15 < (_List_node_base *)0x2710) goto LAB_00119b96;
                bVar6 = (_List_node_base *)0x1869f < p_Var15;
                p_Var15 = (_List_node_base *)((ulong)p_Var15 / 10000);
                cVar5 = cVar16 + '\x04';
              } while (bVar6);
              cVar16 = cVar16 + '\x01';
            }
LAB_00119b96:
            local_98._0_8_ = local_98 + 0x10;
            std::__cxx11::string::_M_construct((ulong)local_98,cVar16);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      ((char *)local_98._0_8_,local_98._8_4_,(unsigned_long)p_Var13);
            plVar8 = (long *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x1ae6b6);
            local_d8._0_8_ = local_d8 + 0x10;
            p_Var13 = (_List_node_base *)(plVar8 + 2);
            if ((_List_node_base *)*plVar8 == p_Var13) {
              local_d8._16_8_ = p_Var13->_M_next;
              local_d8._24_8_ = plVar8[3];
            }
            else {
              local_d8._16_8_ = p_Var13->_M_next;
              local_d8._0_8_ = (_List_node_base *)*plVar8;
            }
            local_d8._8_8_ = plVar8[1];
            *plVar8 = (long)p_Var13;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            local_50._M_array = (iterator)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::nasm::Label,std::allocator<mocker::nasm::Label>,std::__cxx11::string>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_len,
                       (Label **)&local_50,(allocator<mocker::nasm::Label> *)(local_70 + 0x17),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                      );
            nasm::Section::
            emplaceInst<mocker::nasm::CJump,mocker::nasm::CJump::OpType_const&,std::shared_ptr<mocker::nasm::Label>>
                      (text,pOVar9,(shared_ptr<mocker::nasm::Label> *)&local_50);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_len !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_len);
          }
          if ((_List_node_base *)local_d8._0_8_ != (_List_node_base *)(local_d8 + 0x10)) {
            operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
          }
          if ((_List_node_base *)local_98._0_8_ != (_List_node_base *)(local_98 + 0x10)) {
            operator_delete((void *)local_98._0_8_,
                            (ulong)((long)(_Hash_node_base **)local_98._16_8_ + 1));
          }
        }
        if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
        }
        p_Var17 = local_38;
        if (local_70[0x18] != '\0') {
          p_Var14 = p_Var14->_M_next;
        }
        goto joined_r0x00119fc1;
      }
      if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
      }
      p_Var13 = bbIterEnd._M_node[1]._M_next;
      if (*(int *)&p_Var13->_M_prev == 0xb) {
        p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)bbIterEnd._M_node[1]._M_prev;
        if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
          }
        }
      }
      else {
        p_Var13 = (_List_node_base *)0x0;
        p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      if (p_Var13 == (_List_node_base *)0x0) {
        if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
        }
        p_Var13 = bbIterEnd._M_node[1]._M_next;
        if (*(int *)&p_Var13->_M_prev == 0xd) {
          p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)bbIterEnd._M_node[1]._M_prev;
          if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
            }
          }
        }
        else {
          p_Var13 = (_List_node_base *)0x0;
          p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        if (p_Var13 == (_List_node_base *)0x0) {
          if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
          }
          local_d8._0_8_ = bbIterEnd._M_node[1]._M_next;
          if (*(int *)&((_List_node_base *)local_d8._0_8_)->_M_prev == 0xe) {
            local_d8._8_8_ = bbIterEnd._M_node[1]._M_prev;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count
                     + 1;
                UNLOCK();
              }
              else {
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count
                     + 1;
              }
            }
          }
          else {
            local_d8._0_8_ = (_List_node_base *)0x0;
            local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          if ((_List_node_base *)local_d8._0_8_ == (_List_node_base *)0x0) {
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
            }
            p_Var13 = bbIterEnd._M_node[1]._M_next;
            if (*(int *)&p_Var13->_M_prev == 10) {
              p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)bbIterEnd._M_node[1]._M_prev
              ;
              if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
                }
              }
            }
            else {
              p_Var13 = (_List_node_base *)0x0;
              p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            }
            if (p_Var13 == (_List_node_base *)0x0) {
              if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
              }
              p_Var13 = bbIterEnd._M_node[1]._M_next;
              if (*(int *)&p_Var13->_M_prev == 4) {
                p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          bbIterEnd._M_node[1]._M_prev;
                if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var17->_M_use_count = p_Var17->_M_use_count + 1;
                  }
                }
              }
              else {
                p_Var13 = (_List_node_base *)0x0;
                p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              }
              if (p_Var13 == (_List_node_base *)0x0) {
                if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
                }
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/instruction_selection.cpp"
                              ,0x1e7,
                              "ir::InstListIter mocker::(anonymous namespace)::genInst(nasm::Section &, FuncSelectionContext &, const ir::FunctionModule &, ir::BasicBlockList::const_iterator, ir::BasicBlockList::const_iterator, ir::InstListIter)"
                             );
              }
              local_a8._0_8_ = p_Var13[1]._M_prev;
              local_a8._8_8_ = p_Var13[2]._M_next;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_)->_M_use_count =
                       ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_)->
                       _M_use_count + 1;
                  UNLOCK();
                }
                else {
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_)->_M_use_count =
                       ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_)->
                       _M_use_count + 1;
                }
              }
              FuncSelectionContext::getIrAddr
                        ((FuncSelectionContext *)local_98,(shared_ptr<mocker::ir::Addr> *)ctx);
              nasm::dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>>
                        ((nasm *)local_d8,(shared_ptr<mocker::nasm::Addr> *)local_98);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
              }
              if ((_List_node_base *)local_d8._0_8_ == (_List_node_base *)0x0) {
                __assert_fail("dest",
                              "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/instruction_selection.cpp"
                              ,0x1df,
                              "ir::InstListIter mocker::(anonymous namespace)::genInst(nasm::Section &, FuncSelectionContext &, const ir::FunctionModule &, ir::BasicBlockList::const_iterator, ir::BasicBlockList::const_iterator, ir::InstListIter)"
                             );
              }
              FuncSelectionContext::getIrAddr
                        ((FuncSelectionContext *)local_98,(shared_ptr<mocker::ir::Addr> *)ctx);
              nasm::Section::
              emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Addr>>
                        (text,(shared_ptr<mocker::nasm::Register> *)local_d8,
                         (shared_ptr<mocker::nasm::Addr> *)local_98);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
              }
              if (*(int *)&p_Var13[2]._M_prev == 0) {
                local_98._0_8_ = (ulong)(uint)local_98._4_4_ << 0x20;
                nasm::Section::
                emplaceInst<mocker::nasm::UnaryInst,mocker::nasm::UnaryInst::OpType,std::shared_ptr<mocker::nasm::Register>&>
                          (text,(OpType *)local_98,(shared_ptr<mocker::nasm::Register> *)local_d8);
              }
              else {
                local_98._0_4_ = 1;
                nasm::Section::
                emplaceInst<mocker::nasm::UnaryInst,mocker::nasm::UnaryInst::OpType,std::shared_ptr<mocker::nasm::Register>&>
                          (text,(OpType *)local_98,(shared_ptr<mocker::nasm::Register> *)local_d8);
              }
            }
            else {
              local_d8._0_8_ = (_List_node_base *)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<mocker::ir::Call,std::allocator<mocker::ir::Call>,std::shared_ptr<mocker::ir::Reg>const&,char_const(&)[8],std::shared_ptr<mocker::ir::Addr>const&>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8),
                         (Call **)local_d8,(allocator<mocker::ir::Call> *)local_98,
                         (shared_ptr<mocker::ir::Reg> *)&p_Var13[1]._M_prev,(char (*) [8])"__alloc",
                         (shared_ptr<mocker::ir::Addr> *)&p_Var13[2]._M_prev);
              genCall(text,ctx,(shared_ptr<mocker::ir::Call> *)local_d8);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
            }
          }
          else {
            genCall(text,ctx,(shared_ptr<mocker::ir::Call> *)local_d8);
            p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
          }
          if (p_Var17 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            return (InstListIter)p_Var14;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
          return (InstListIter)p_Var14;
        }
        if (p_Var13[1]._M_prev != (_List_node_base *)0x0) {
          FuncSelectionContext::getIrAddr
                    ((FuncSelectionContext *)local_d8,(shared_ptr<mocker::ir::Addr> *)ctx);
          args_00 = nasm::rax();
          nasm::Section::
          emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Addr>&>
                    (text,args_00,(shared_ptr<mocker::nasm::Addr> *)local_d8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
          }
        }
        pkVar2 = DAT_001f42e8;
        if ((anonymous_namespace)::CalleeSave != DAT_001f42e8) {
          __k = (anonymous_namespace)::CalleeSave;
          do {
            cVar10 = std::
                     _Hashtable<std::shared_ptr<mocker::nasm::Register>,_std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>_>,_std::__detail::_Select1st,_mocker::nasm::RegPtrEqual,_mocker::nasm::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&(ctx->pRegAddr)._M_h,__k);
            if (cVar10.
                super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              std::__throw_out_of_range("_Map_base::at");
            }
            nasm::Section::
            emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Register>const&>
                      (text,__k,(shared_ptr<mocker::nasm::Register> *)
                                ((long)cVar10.
                                       super__Node_iterator_base<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::shared_ptr<mocker::nasm::Register>_>,_true>
                                       ._M_cur + 0x18));
            __k = __k + 1;
          } while (__k != pkVar2);
        }
        nasm::Section::emplaceInst<mocker::nasm::Leave>(text);
        nasm::Section::emplaceInst<mocker::nasm::Ret>(text);
        goto joined_r0x00119fc1;
      }
      if (p_Var15 == curBBIter._M_node) {
        p_Var15 = (_List_node_base *)0xffffffffffffffff;
      }
      else {
        p_Var15 = p_Var15[1]._M_next;
      }
      p_Var12 = (_List_node_base *)(local_d8 + 0x10);
      local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_d8._16_8_ = local_d8._16_8_ & 0xffffffffffffff00;
      local_d8._0_8_ = p_Var12;
      local_70._24_8_ = p_Var17;
      FuncSelectionContext::newVirtualReg((FuncSelectionContext *)local_a8,(string *)ctx);
      if ((_List_node_base *)local_d8._0_8_ != p_Var12) {
        operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
      }
      FuncSelectionContext::getIrAddr
                ((FuncSelectionContext *)local_d8,(shared_ptr<mocker::ir::Addr> *)ctx);
      nasm::Section::
      emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Addr>>
                (text,(shared_ptr<mocker::nasm::Register> *)local_a8,
                 (shared_ptr<mocker::nasm::Addr> *)local_d8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
      }
      local_d8._0_8_ = (element_type *)0x0;
      local_d8._8_8_ = operator_new(0x20);
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_use_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_M_weak_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_)->_vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_001efff8;
      local_d8._0_8_ = local_d8._8_8_ + 0x10;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._8_8_ + 0x10))->
      _vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001f0048;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._8_8_ + 0x10))->_M_use_count = 0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_d8._8_8_ + 0x10))->_M_weak_count = 0;
      nasm::Section::
      emplaceInst<mocker::nasm::Cmp,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::NumericConstant>>
                (text,(shared_ptr<mocker::nasm::Register> *)local_a8,
                 (shared_ptr<mocker::nasm::NumericConstant> *)local_d8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
      }
      if ((p_Var13[2]._M_prev)->_M_prev == p_Var15) {
        local_50._M_array = (iterator)((ulong)local_50._M_array._4_4_ << 0x20);
        p_Var13 = (p_Var13[3]._M_prev)->_M_prev;
        cVar16 = '\x01';
        if ((_List_node_base *)0x9 < p_Var13) {
          p_Var15 = p_Var13;
          cVar5 = '\x04';
          do {
            cVar16 = cVar5;
            if (p_Var15 < (_List_node_base *)0x64) {
              cVar16 = cVar16 + -2;
              goto LAB_00119d3e;
            }
            if (p_Var15 < (_List_node_base *)0x3e8) {
              cVar16 = cVar16 + -1;
              goto LAB_00119d3e;
            }
            if (p_Var15 < (_List_node_base *)0x2710) goto LAB_00119d3e;
            bVar6 = (_List_node_base *)0x1869f < p_Var15;
            p_Var15 = (_List_node_base *)((ulong)p_Var15 / 10000);
            cVar5 = cVar16 + '\x04';
          } while (bVar6);
          cVar16 = cVar16 + '\x01';
        }
LAB_00119d3e:
        local_98._0_8_ = (_List_node_base *)(local_98 + 0x10);
        std::__cxx11::string::_M_construct((ulong)local_98,cVar16);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)local_98._0_8_,local_98._8_4_,(unsigned_long)p_Var13);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x1ae6b6);
        p_Var13 = (_List_node_base *)(plVar8 + 2);
        if ((_List_node_base *)*plVar8 == p_Var13) {
          local_d8._16_8_ = p_Var13->_M_next;
          local_d8._24_8_ = plVar8[3];
          local_d8._0_8_ = p_Var12;
        }
        else {
          local_d8._16_8_ = p_Var13->_M_next;
          local_d8._0_8_ = (_List_node_base *)*plVar8;
        }
        local_d8._8_8_ = plVar8[1];
        *plVar8 = (long)p_Var13;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        local_70._0_8_ = (Label *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<mocker::nasm::Label,std::allocator<mocker::nasm::Label>,std::__cxx11::string>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8),(Label **)local_70,
                   (allocator<mocker::nasm::Label> *)&local_3c,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
        nasm::Section::
        emplaceInst<mocker::nasm::CJump,mocker::nasm::CJump::OpType,std::shared_ptr<mocker::nasm::Label>>
                  (text,(OpType *)&local_50,(shared_ptr<mocker::nasm::Label> *)local_70);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
        }
        if ((_List_node_base *)local_d8._0_8_ != p_Var12) {
          operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
        }
        if ((_List_node_base *)local_98._0_8_ != (_List_node_base *)(local_98 + 0x10)) {
          operator_delete((void *)local_98._0_8_,
                          (ulong)((long)(_Hash_node_base **)local_98._16_8_ + 1));
        }
      }
      else if ((p_Var13[3]._M_prev)->_M_prev == p_Var15) {
        local_50._M_array = (iterator)CONCAT44(local_50._M_array._4_4_,1);
        p_Var13 = (p_Var13[2]._M_prev)->_M_prev;
        cVar16 = '\x01';
        if ((_List_node_base *)0x9 < p_Var13) {
          p_Var15 = p_Var13;
          cVar5 = '\x04';
          do {
            cVar16 = cVar5;
            if (p_Var15 < (_List_node_base *)0x64) {
              cVar16 = cVar16 + -2;
              goto LAB_00119ea5;
            }
            if (p_Var15 < (_List_node_base *)0x3e8) {
              cVar16 = cVar16 + -1;
              goto LAB_00119ea5;
            }
            if (p_Var15 < (_List_node_base *)0x2710) goto LAB_00119ea5;
            bVar6 = (_List_node_base *)0x1869f < p_Var15;
            p_Var15 = (_List_node_base *)((ulong)p_Var15 / 10000);
            cVar5 = cVar16 + '\x04';
          } while (bVar6);
          cVar16 = cVar16 + '\x01';
        }
LAB_00119ea5:
        local_98._0_8_ = (_List_node_base *)(local_98 + 0x10);
        std::__cxx11::string::_M_construct((ulong)local_98,cVar16);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)local_98._0_8_,local_98._8_4_,(unsigned_long)p_Var13);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x1ae6b6);
        p_Var13 = (_List_node_base *)(plVar8 + 2);
        if ((_List_node_base *)*plVar8 == p_Var13) {
          local_d8._16_8_ = p_Var13->_M_next;
          local_d8._24_8_ = plVar8[3];
          local_d8._0_8_ = p_Var12;
        }
        else {
          local_d8._16_8_ = p_Var13->_M_next;
          local_d8._0_8_ = (_List_node_base *)*plVar8;
        }
        local_d8._8_8_ = plVar8[1];
        *plVar8 = (long)p_Var13;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        local_70._0_8_ = (Label *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<mocker::nasm::Label,std::allocator<mocker::nasm::Label>,std::__cxx11::string>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8),(Label **)local_70,
                   (allocator<mocker::nasm::Label> *)&local_3c,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
        nasm::Section::
        emplaceInst<mocker::nasm::CJump,mocker::nasm::CJump::OpType,std::shared_ptr<mocker::nasm::Label>>
                  (text,(OpType *)&local_50,(shared_ptr<mocker::nasm::Label> *)local_70);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
        }
        if ((_List_node_base *)local_d8._0_8_ != p_Var12) {
          operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
        }
        if ((_List_node_base *)local_98._0_8_ != (_List_node_base *)(local_98 + 0x10)) {
LAB_00119f96:
          operator_delete((void *)local_98._0_8_,
                          (ulong)((long)(_Hash_node_base **)local_98._16_8_ + 1));
        }
      }
      else {
        local_50._M_array = (iterator)((ulong)local_50._M_array._4_4_ << 0x20);
        p_Var15 = (p_Var13[3]._M_prev)->_M_prev;
        cVar16 = '\x01';
        if ((_List_node_base *)0x9 < p_Var15) {
          p_Var11 = p_Var15;
          cVar5 = '\x04';
          do {
            cVar16 = cVar5;
            if (p_Var11 < (_List_node_base *)0x64) {
              cVar16 = cVar16 + -2;
              goto LAB_00119fce;
            }
            if (p_Var11 < (_List_node_base *)0x3e8) {
              cVar16 = cVar16 + -1;
              goto LAB_00119fce;
            }
            if (p_Var11 < (_List_node_base *)0x2710) goto LAB_00119fce;
            bVar6 = (_List_node_base *)0x1869f < p_Var11;
            p_Var11 = (_List_node_base *)((ulong)p_Var11 / 10000);
            cVar5 = cVar16 + '\x04';
          } while (bVar6);
          cVar16 = cVar16 + '\x01';
        }
LAB_00119fce:
        p_Var11 = (_List_node_base *)(local_98 + 0x10);
        local_98._0_8_ = p_Var11;
        std::__cxx11::string::_M_construct((ulong)local_98,cVar16);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)local_98._0_8_,local_98._8_4_,(unsigned_long)p_Var15);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x1ae6b6);
        p_Var15 = (_List_node_base *)(plVar8 + 2);
        if ((_List_node_base *)*plVar8 == p_Var15) {
          local_d8._16_8_ = p_Var15->_M_next;
          local_d8._24_8_ = plVar8[3];
          local_d8._0_8_ = p_Var12;
        }
        else {
          local_d8._16_8_ = p_Var15->_M_next;
          local_d8._0_8_ = (_List_node_base *)*plVar8;
        }
        local_d8._8_8_ = plVar8[1];
        *plVar8 = (long)p_Var15;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        local_70._0_8_ = (Label *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<mocker::nasm::Label,std::allocator<mocker::nasm::Label>,std::__cxx11::string>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8),(Label **)local_70,
                   (allocator<mocker::nasm::Label> *)&local_3c,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
        nasm::Section::
        emplaceInst<mocker::nasm::CJump,mocker::nasm::CJump::OpType,std::shared_ptr<mocker::nasm::Label>>
                  (text,(OpType *)&local_50,(shared_ptr<mocker::nasm::Label> *)local_70);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
        }
        if ((_List_node_base *)local_d8._0_8_ != p_Var12) {
          operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
        }
        if ((_List_node_base *)local_98._0_8_ != p_Var11) {
          operator_delete((void *)local_98._0_8_,
                          (ulong)((long)(_Hash_node_base **)local_98._16_8_ + 1));
        }
        p_Var13 = (p_Var13[2]._M_prev)->_M_prev;
        cVar16 = '\x01';
        if ((_List_node_base *)0x9 < p_Var13) {
          p_Var15 = p_Var13;
          cVar5 = '\x04';
          do {
            cVar16 = cVar5;
            if (p_Var15 < (_List_node_base *)0x64) {
              cVar16 = cVar16 + -2;
              goto LAB_0011a12e;
            }
            if (p_Var15 < (_List_node_base *)0x3e8) {
              cVar16 = cVar16 + -1;
              goto LAB_0011a12e;
            }
            if (p_Var15 < (_List_node_base *)0x2710) goto LAB_0011a12e;
            bVar6 = (_List_node_base *)0x1869f < p_Var15;
            p_Var15 = (_List_node_base *)((ulong)p_Var15 / 10000);
            cVar5 = cVar16 + '\x04';
          } while (bVar6);
          cVar16 = cVar16 + '\x01';
        }
LAB_0011a12e:
        local_98._0_8_ = p_Var11;
        std::__cxx11::string::_M_construct((ulong)local_98,cVar16);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)local_98._0_8_,local_98._8_4_,(unsigned_long)p_Var13);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x1ae6b6);
        p_Var13 = (_List_node_base *)(plVar8 + 2);
        if ((_List_node_base *)*plVar8 == p_Var13) {
          local_d8._16_8_ = p_Var13->_M_next;
          local_d8._24_8_ = plVar8[3];
          local_d8._0_8_ = p_Var12;
        }
        else {
          local_d8._16_8_ = p_Var13->_M_next;
          local_d8._0_8_ = (_List_node_base *)*plVar8;
        }
        local_d8._8_8_ = plVar8[1];
        *plVar8 = (long)p_Var13;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        local_70._0_8_ = (Label *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<mocker::nasm::Label,std::allocator<mocker::nasm::Label>,std::__cxx11::string>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8),(Label **)local_70,
                   (allocator<mocker::nasm::Label> *)&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
        nasm::Section::emplaceInst<mocker::nasm::Jmp,std::shared_ptr<mocker::nasm::Label>>
                  (text,(shared_ptr<mocker::nasm::Label> *)local_70);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
        }
        if ((_List_node_base *)local_d8._0_8_ != p_Var12) {
          operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
        }
        if ((_List_node_base *)local_98._0_8_ != p_Var11) goto LAB_00119f96;
      }
      p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._24_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
        p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._24_8_;
      }
      goto joined_r0x00119fc1;
    }
    FuncSelectionContext::getIrAddr
              ((FuncSelectionContext *)local_d8,(shared_ptr<mocker::ir::Addr> *)ctx);
    ir::detail::dyc_impl<mocker::ir::Reg,std::shared_ptr<mocker::ir::Addr>const&>
              ((shared_ptr<mocker::ir::Addr> *)local_98,(Reg *)(p_Var13 + 1));
    if ((_List_node_base *)local_98._0_8_ == (_List_node_base *)0x0) {
      __assert_fail("irAddr",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/instruction_selection.cpp"
                    ,0x65,
                    "void mocker::(anonymous namespace)::genStore(nasm::Section &, FuncSelectionContext &, const std::shared_ptr<ir::Store> &)"
                   );
    }
    local_70._0_8_ = local_98._0_8_;
    local_70._8_8_ = local_98._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_98._8_8_ + 8) = *(_Atomic_word *)(local_98._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_98._8_8_ + 8) = *(_Atomic_word *)(local_98._8_8_ + 8) + 1;
      }
    }
    ir::dycGlobalReg((ir *)local_a8,(shared_ptr<mocker::ir::Addr> *)local_70);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
    }
    if ((element_type *)local_a8._0_8_ == (element_type *)0x0) {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
      }
      FuncSelectionContext::buildMemAddr
                ((FuncSelectionContext *)local_a8,(shared_ptr<mocker::ir::Reg> *)ctx);
      nasm::Section::
      emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::MemoryAddr>,std::shared_ptr<mocker::nasm::Addr>&>
                (text,(shared_ptr<mocker::nasm::MemoryAddr> *)local_a8,
                 (shared_ptr<mocker::nasm::Addr> *)local_d8);
    }
    else {
      makeLabelAddr((anon_unknown_0 *)local_70,(shared_ptr<mocker::ir::Reg> *)local_a8);
      nasm::Section::
      emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::LabelAddr>,std::shared_ptr<mocker::nasm::Addr>&>
                (text,(shared_ptr<mocker::nasm::LabelAddr> *)local_70,
                 (shared_ptr<mocker::nasm::Addr> *)local_d8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
    }
    p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
      p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
    }
  }
  else {
    local_98._0_8_ = p_Var13[1]._M_prev;
    local_98._8_8_ = p_Var13[2]._M_next;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_)->_M_use_count + 1;
      }
    }
    FuncSelectionContext::getIrAddr
              ((FuncSelectionContext *)local_d8,(shared_ptr<mocker::ir::Addr> *)ctx);
    FuncSelectionContext::getIrAddr
              ((FuncSelectionContext *)local_a8,(shared_ptr<mocker::ir::Addr> *)ctx);
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Addr>,std::shared_ptr<mocker::nasm::Addr>>
              (text,(shared_ptr<mocker::nasm::Addr> *)local_d8,
               (shared_ptr<mocker::nasm::Addr> *)local_a8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
    }
    p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
      p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_;
    }
  }
  if (p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var18);
  }
joined_r0x00119fc1:
  if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
  }
  return (InstListIter)p_Var14;
}

Assistant:

ir::InstListIter genInst(nasm::Section &text, FuncSelectionContext &ctx,
                         const ir::FunctionModule &func,
                         ir::BasicBlockList::const_iterator curBBIter,
                         ir::BasicBlockList::const_iterator bbIterEnd,
                         ir::InstListIter curInstIter) {
  auto &inst = *curInstIter;
  auto nextIter = curInstIter;
  ++nextIter;
  auto nextBBIter = curBBIter;
  ++nextBBIter;

  if (ir::dyc<ir::Comment>(inst) || ir::dyc<ir::AttachedComment>(inst))
    return nextIter;

  if (ir::dyc<ir::Phi>(inst))
    return nextIter;

  if (auto p = ir::dyc<ir::Assign>(inst)) {
    text.emplaceInst<nasm::Mov>(ctx.getIrAddr(p->getDest()),
                                ctx.getIrAddr(p->getOperand()));
    return nextIter;
  }

  if (auto p = ir::dyc<ir::Jump>(inst)) {
    if (nextBBIter == bbIterEnd ||
        nextBBIter->getLabelID() != p->getLabel()->getID())
      text.emplaceInst<nasm::Jmp>(std::make_shared<nasm::Label>(
          ".L" + std::to_string(p->getLabel()->getID())));
    return nextIter;
  }

  if (auto p = ir::dyc<ir::Store>(inst)) {
    genStore(text, ctx, p);
    return nextIter;
  }
  if (auto p = ir::dyc<ir::Load>(inst)) {
    genLoad(text, ctx, p);
    return nextIter;
  }

  if (auto p = ir::dyc<ir::ArithBinaryInst>(inst)) {
    auto nextInst = *nextIter;
    auto add = ir::dyc<ir::ArithBinaryInst>(nextInst);
    if (!add) {
      genArithBinary(text, ctx, p);
      return nextIter;
    }
    auto nextNextIter = nextIter;
    ++nextNextIter;
    if (tryCombineMemInst(text, ctx, p, add, *nextNextIter)) {
      ++nextIter;
      ++nextIter;
    } else {
      genArithBinary(text, ctx, p);
    }
    return nextIter;
  }

  if (auto p = ir::dyc<ir::RelationInst>(inst)) {
    auto skip =
        genRelation(text, ctx, p, *nextIter,
                    nextBBIter == bbIterEnd ? -1 : nextBBIter->getLabelID());
    if (skip)
      ++nextIter;
    return nextIter;
  }

  if (auto p = ir::dyc<ir::Branch>(inst)) {
    genBranch(text, ctx, p,
              nextBBIter == bbIterEnd ? -1 : nextBBIter->getLabelID());
    return nextIter;
  }

  if (auto p = ir::dyc<ir::Ret>(inst)) {
    if (p->getVal()) {
      auto val = ctx.getIrAddr(p->getVal());
      text.emplaceInst<nasm::Mov>(nasm::rax(), val);
    }
    for (auto &reg : CalleeSave) {
      text.emplaceInst<nasm::Mov>(reg, ctx.getPRegAddr(reg));
    }
    text.emplaceInst<nasm::Leave>();
    text.emplaceInst<nasm::Ret>();
    return nextIter;
  }

  if (auto p = ir::dyc<ir::Call>(inst)) {
    genCall(text, ctx, p);
    return nextIter;
  }
  if (auto p = ir::dyc<ir::Malloc>(inst)) {
    genCall(text, ctx,
            std::make_shared<ir::Call>(p->getDest(), "__alloc", p->getSize()));
    return nextIter;
  }

  if (auto p = ir::dyc<ir::ArithUnaryInst>(inst)) {
    auto dest = nasm::dyc<nasm::Register>(ctx.getIrAddr(p->getDest()));
    assert(dest);
    text.emplaceInst<nasm::Mov>(dest, ctx.getIrAddr(p->getOperand()));
    if (p->getOp() == ir::ArithUnaryInst::Neg)
      text.emplaceInst<nasm::UnaryInst>(nasm::UnaryInst::Neg, dest);
    else
      text.emplaceInst<nasm::UnaryInst>(nasm::UnaryInst::Not, dest);
    return nextIter;
  }
  assert(false);
}